

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O0

Matrix * __thiscall CSR::turnToRegular(CSR *this)

{
  int row;
  int col;
  Matrix *this_00;
  int local_58;
  int local_54;
  int j;
  int i;
  allocator local_39;
  string local_38;
  Matrix *y;
  CSR *this_local;
  
  y = (Matrix *)this;
  this_00 = (Matrix *)operator_new(0x30);
  row = this->row;
  col = this->col;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"turn to regular:",&local_39);
  Matrix::Matrix(this_00,row,col,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  for (local_54 = 0; local_54 < this->row; local_54 = local_54 + 1) {
    for (local_58 = this->ptr[local_54]; local_58 < this->ptr[local_54 + 1]; local_58 = local_58 + 1
        ) {
      this_00->array[local_54][this->idx[local_58]] = this->val[local_58];
    }
  }
  return this_00;
}

Assistant:

Matrix* CSR::turnToRegular()
{

    Matrix *y = new Matrix(row, col, "turn to regular:");

    for (int i = 0; i < row; i++)
    {
        for (int j = ptr[i]; j < ptr[i + 1]; j++)
        {

            y->array[i][idx[j]] = val[j];

        }
    }
    return y;
}